

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int ffh_pairs(lua_State *L,MMS mm)

{
  int iVar1;
  TValue *o;
  cTValue *pcVar2;
  ulong uVar3;
  
  o = lj_lib_checkany(L,1);
  pcVar2 = lj_meta_lookup(L,o,mm);
  uVar3 = o->u64 & 0xffff800000000000;
  if (uVar3 == 0xfffa000000000000) {
    o[-1] = (TValue)o->u64;
    o[-2].u64 = *(ulong *)((L->base[-2].u64 & 0x7fffffffffff) + 0x30) & 0x7fffffffffff |
                0xfffb800000000000;
    if (mm == MM_pairs) {
      o->u64 = 0xffffffffffffffff;
    }
    else {
      o->u64 = 0;
    }
    iVar1 = 4;
  }
  else {
    if ((uVar3 != 0xfffa800000000000) || (pcVar2->u64 == 0xffffffffffffffff)) {
      lj_err_argt(L,1,5);
    }
    L->top = o + 1;
    L->base[-2] = *pcVar2;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int ffh_pairs(lua_State *L, MMS mm)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo = lj_meta_lookup(L, o, mm);
  if ((LJ_52 || tviscdata(o)) && !tvisnil(mo)) {
    L->top = o+1;  /* Only keep one argument. */
    copyTV(L, L->base-1-LJ_FR2, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  } else {
    if (!tvistab(o)) lj_err_argt(L, 1, LUA_TTABLE);
    if (LJ_FR2) { copyTV(L, o-1, o); o--; }
    setfuncV(L, o-1, funcV(lj_lib_upvalue(L, 1)));
    if (mm == MM_pairs) setnilV(o+1); else setintV(o+1, 0);
    return FFH_RES(3);
  }
}